

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O1

void nni_task_exec(nni_task *task)

{
  nni_mtx *mtx;
  uint *puVar1;
  
  mtx = &task->task_mtx;
  nni_mtx_lock(mtx);
  if (task->task_prep == true) {
    task->task_prep = false;
  }
  else {
    task->task_busy = task->task_busy + 1;
  }
  if (task->task_cb != (nni_cb)0x0) {
    nni_mtx_unlock(mtx);
    (*task->task_cb)(task->task_arg);
    nni_mtx_lock(mtx);
  }
  puVar1 = &task->task_busy;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    nni_cv_wake(&task->task_cv);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

void
nni_task_exec(nni_task *task)
{
	nni_mtx_lock(&task->task_mtx);
	if (task->task_prep) {
		task->task_prep = false;
	} else {
		task->task_busy++;
	}

	if (task->task_cb != NULL) {
		nni_mtx_unlock(&task->task_mtx);
		task->task_cb(task->task_arg);
		nni_mtx_lock(&task->task_mtx);
	}

	task->task_busy--;
	if (task->task_busy == 0) {
		nni_cv_wake(&task->task_cv);
	}
	nni_mtx_unlock(&task->task_mtx);
}